

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrQuerySpatialAnchorsAsyncML
                   (XrSpatialAnchorsStorageML storage,
                   XrSpatialAnchorsQueryInfoBaseHeaderML *queryInfo,XrFutureEXT *future)

{
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar1;
  ValidateXrHandleResult VVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  allocator local_539;
  string local_538 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_518;
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_488;
  allocator local_469;
  string local_468 [39];
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3f8;
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [8];
  string error_message;
  allocator local_361;
  string local_360 [32];
  XrSpatialAnchorsQueryInfoRadiusML *local_340;
  XrSpatialAnchorsQueryInfoRadiusML *new_spatialanchorsqueryinforadiusml_value;
  string local_330 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_310;
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  GenValidUsageXrInstanceInfo *local_2a8;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_spatialanchorsstorageml_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_280 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_260;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  XrSpatialAnchorsStorageML_T local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_4c;
  undefined1 local_48 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrFutureEXT *future_local;
  XrSpatialAnchorsQueryInfoBaseHeaderML *queryInfo_local;
  XrSpatialAnchorsStorageML storage_local;
  GenValidUsageXrInstanceInfo *pGVar3;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  queryInfo_local = (XrSpatialAnchorsQueryInfoBaseHeaderML *)storage;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  local_4c = XR_OBJECT_TYPE_SPATIAL_ANCHORS_STORAGE_ML;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSpatialAnchorsStorageML_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_48
             ,(XrSpatialAnchorsStorageML_T **)&queryInfo_local,&local_4c);
  VVar2 = VerifyXrSpatialAnchorsStorageMLHandle((XrSpatialAnchorsStorageML *)&queryInfo_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrSpatialAnchorsStorageML_T_*>::getWithInstanceInfo
                      (&g_spatialanchorsstorageml_info,
                       (XrSpatialAnchorsStorageML_T *)queryInfo_local);
    pGVar3 = pVar4.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar4.first;
    local_2a8 = pGVar3;
    gen_spatialanchorsstorageml_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar3;
    if (queryInfo == (XrSpatialAnchorsQueryInfoBaseHeaderML *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c8,"VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",&local_2c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,"xrQuerySpatialAnchorsAsyncML",&local_2f1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_310,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_330,
                 "Invalid NULL for XrSpatialAnchorsQueryInfoBaseHeaderML \"queryInfo\" which is not optional and must be non-NULL"
                 ,(allocator *)((long)&new_spatialanchorsqueryinforadiusml_value + 7));
      CoreValidLogMessage(pGVar3,(string *)local_2c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2f0,&local_310,(string *)local_330);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&new_spatialanchorsqueryinforadiusml_value + 7));
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_310);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      storage_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      local_340 = (XrSpatialAnchorsQueryInfoRadiusML *)queryInfo;
      pVar1 = pVar4;
      if (queryInfo->type == XR_TYPE_SPATIAL_ANCHORS_QUERY_INFO_RADIUS_ML) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_360,"xrQuerySpatialAnchorsAsyncML",&local_361);
        objects_info.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             ValidateXrStruct(pGVar3,(string *)local_360,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)local_48,false,true,local_340);
        std::__cxx11::string::~string(local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
        pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
        pVar1.first = gen_spatialanchorsstorageml_info;
        pVar4.second = local_2a8;
        pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
        if (objects_info.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_388,"Command xrQuerySpatialAnchorsAsyncML param queryInfo",&local_389);
          std::allocator<char>::~allocator((allocator<char> *)&local_389);
          std::__cxx11::string::operator+=(local_388," is invalid");
          pGVar3 = local_2a8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_3b0,"VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",&local_3b1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3d8,"xrQuerySpatialAnchorsAsyncML",&local_3d9);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_3f8,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_48);
          CoreValidLogMessage(pGVar3,(string *)local_3b0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_3d8,&local_3f8,(string *)local_388);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_3f8);
          std::__cxx11::string::~string(local_3d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
          std::__cxx11::string::~string(local_3b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
          storage_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          info_with_instance.second._4_4_ = 1;
          std::__cxx11::string::~string(local_388);
          goto LAB_002e73a4;
        }
      }
      info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
      gen_spatialanchorsstorageml_info = pVar1.first;
      local_2a8 = pVar4.second;
      pGVar3 = local_2a8;
      gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar4.first;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_418,"xrQuerySpatialAnchorsAsyncML",&local_419);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar3,(string *)local_418,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_48,true,true,queryInfo);
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      pGVar3 = local_2a8;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        if (future == (XrFutureEXT *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_4d0,"VUID-xrQuerySpatialAnchorsAsyncML-future-parameter",&local_4d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_4f8,"xrQuerySpatialAnchorsAsyncML",&local_4f9);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_518,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_48);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_538,
                     "Invalid NULL for XrFutureEXT \"future\" which is not optional and must be non-NULL"
                     ,&local_539);
          CoreValidLogMessage(pGVar3,(string *)local_4d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_4f8,&local_518,(string *)local_538);
          std::__cxx11::string::~string(local_538);
          std::allocator<char>::~allocator((allocator<char> *)&local_539);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_518);
          std::__cxx11::string::~string(local_4f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
          std::__cxx11::string::~string(local_4d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
          storage_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          info_with_instance.second._4_4_ = 1;
        }
        else {
          storage_local._4_4_ =
               objects_info.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          info_with_instance.second._4_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_440,"VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",&local_441);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_468,"xrQuerySpatialAnchorsAsyncML",&local_469);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_488,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_4a8,"Command xrQuerySpatialAnchorsAsyncML param queryInfo is invalid",
                   &local_4a9);
        CoreValidLogMessage(pGVar3,(string *)local_440,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_468,&local_488,(string *)local_4a8);
        std::__cxx11::string::~string(local_4a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_488);
        std::__cxx11::string::~string(local_468);
        std::allocator<char>::~allocator((allocator<char> *)&local_469);
        std::__cxx11::string::~string(local_440);
        std::allocator<char>::~allocator((allocator<char> *)&local_441);
        storage_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    std::operator<<((ostream *)local_1d8,"Invalid XrSpatialAnchorsStorageML handle \"storage\" ");
    HandleToHexString<XrSpatialAnchorsStorageML_T*>(local_1f8);
    std::operator<<((ostream *)local_1d8,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_218,"VUID-xrQuerySpatialAnchorsAsyncML-storage-parameter",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"xrQuerySpatialAnchorsAsyncML",&local_241);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_260,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_48);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_218,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_240,&local_260,local_280);
    std::__cxx11::string::~string((string *)local_280);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_260);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    storage_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
LAB_002e73a4:
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  return storage_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrQuerySpatialAnchorsAsyncML(
XrSpatialAnchorsStorageML storage,
const XrSpatialAnchorsQueryInfoBaseHeaderML* queryInfo,
XrFutureEXT* future) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(storage, XR_OBJECT_TYPE_SPATIAL_ANCHORS_STORAGE_ML);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpatialAnchorsStorageMLHandle(&storage);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpatialAnchorsStorageML handle \"storage\" ";
                oss << HandleToHexString(storage);
                CoreValidLogMessage(nullptr, "VUID-xrQuerySpatialAnchorsAsyncML-storage-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySpatialAnchorsAsyncML",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_spatialanchorsstorageml_info.getWithInstanceInfo(storage);
        GenValidUsageXrHandleInfo *gen_spatialanchorsstorageml_info = info_with_instance.first;
        (void)gen_spatialanchorsstorageml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == queryInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySpatialAnchorsAsyncML", objects_info,
                                "Invalid NULL for XrSpatialAnchorsQueryInfoBaseHeaderML \"queryInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate if XrSpatialAnchorsQueryInfoBaseHeaderML is a child structure of type XrSpatialAnchorsQueryInfoRadiusML and it is valid
        {
            const XrSpatialAnchorsQueryInfoRadiusML* new_spatialanchorsqueryinforadiusml_value = reinterpret_cast<const XrSpatialAnchorsQueryInfoRadiusML*>(queryInfo);
            if (new_spatialanchorsqueryinforadiusml_value->type == XR_TYPE_SPATIAL_ANCHORS_QUERY_INFO_RADIUS_ML) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrQuerySpatialAnchorsAsyncML",
                                                                objects_info,false, true, new_spatialanchorsqueryinforadiusml_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrQuerySpatialAnchorsAsyncML param queryInfo";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySpatialAnchorsAsyncML",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate that the base-structure XrSpatialAnchorsQueryInfoBaseHeaderML is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrQuerySpatialAnchorsAsyncML", objects_info,
                                                        true, true, queryInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySpatialAnchorsAsyncML",
                                objects_info,
                                "Command xrQuerySpatialAnchorsAsyncML param queryInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == future) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySpatialAnchorsAsyncML-future-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySpatialAnchorsAsyncML", objects_info,
                                "Invalid NULL for XrFutureEXT \"future\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrQuerySpatialAnchorsAsyncML-future-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}